

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmdate.cpp
# Opt level: O0

void __thiscall CVmDateLocale::CVmDateLocale(CVmDateLocale *this)

{
  vm_obj_id_t vVar1;
  int iVar2;
  CVmObject *pCVar3;
  vm_val_t *pvVar4;
  vm_obj_id_t *in_RDI;
  vm_val_t *val;
  CVmObject *local_30;
  vm_obj_id_t local_24;
  CVmMetaclass *in_stack_ffffffffffffffe0;
  
  vVar1 = CVmMetaclass::get_class_obj(in_stack_ffffffffffffffe0);
  if (vVar1 != 0) {
    CVmMetaclass::get_class_obj(in_stack_ffffffffffffffe0);
    pCVar3 = vm_objp(0);
    iVar2 = (*pCVar3->_vptr_CVmObject[1])(pCVar3,CVmObjClass::metaclass_reg_);
    if (iVar2 != 0) {
      CVmMetaclass::get_class_obj(in_stack_ffffffffffffffe0);
      vm_objp(0);
    }
  }
  pvVar4 = CVmObjClass::get_class_state((CVmObjClass *)0x348cac);
  if (pvVar4->typ == VM_OBJ) {
    local_24 = (pvVar4->val).obj;
  }
  else {
    local_24 = 0;
  }
  *in_RDI = local_24;
  if (*in_RDI != 0) {
    pCVar3 = vm_objp(0);
    iVar2 = (*pCVar3->_vptr_CVmObject[1])(pCVar3,CVmObjVector::metaclass_reg_);
    if (iVar2 != 0) {
      local_30 = vm_objp(0);
      goto LAB_00348d21;
    }
  }
  local_30 = (CVmObject *)0x0;
LAB_00348d21:
  *(CVmObject **)(in_RDI + 2) = local_30;
  return;
}

Assistant:

CVmDateLocale(VMG0_)
    {
        /* get the state Vector from the Date static class state holder */
        const vm_val_t *val = vm_classobj_for(CVmObjDate)->get_class_state();
        vecid = val->typ == VM_OBJ ? val->val.obj : VM_INVALID_OBJ;
        vec = vm_objid_cast(CVmObjVector, vecid);
    }